

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetInterpolantType(void *arkode_mem,int itype)

{
  ARKInterp p_Var1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
  }
  else if ((uint)itype < 2) {
    if (*(int *)((long)arkode_mem + 0x260) != 0) {
      arkProcessError((ARKodeMem)arkode_mem,-0x28,"ARKode","arkSetInterpolantType",
                      "Type cannot be specified after module initialization.");
      return -0x16;
    }
    if (*(ARKInterp *)((long)arkode_mem + 0x148) != (ARKInterp)0x0) {
      arkInterpFree(arkode_mem,*(ARKInterp *)((long)arkode_mem + 0x148));
      *(undefined8 *)((long)arkode_mem + 0x148) = 0;
    }
    if (itype == 0) {
      p_Var1 = arkInterpCreate_Hermite(arkode_mem,5);
    }
    else {
      p_Var1 = arkInterpCreate_Lagrange(arkode_mem,5);
    }
    *(ARKInterp *)((long)arkode_mem + 0x148) = p_Var1;
    if (p_Var1 != (ARKInterp)0x0) {
      return 0;
    }
    msgfmt = "Unable to allocate interpolation structure";
    iVar2 = -0x14;
    error_code = -0x14;
  }
  else {
    msgfmt = "Illegal interpolation type input.";
    iVar2 = -0x16;
    error_code = -0x16;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,"ARKode","arkSetInterpolantType",msgfmt);
  return iVar2;
}

Assistant:

int arkSetInterpolantType(void *arkode_mem, int itype)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetInterpolantType", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* check for legal itype input */
  if ((itype != ARK_INTERP_HERMITE) && (itype != ARK_INTERP_LAGRANGE)) {
    arkProcessError(ark_mem, ARK_ILL_INPUT, "ARKode",
                    "arkSetInterpolantType",
                    "Illegal interpolation type input.");
    return(ARK_ILL_INPUT);
  }

  /* do not change type once the module has been initialized */
  if (ark_mem->initialized) {
    arkProcessError(ark_mem, ARK_INTERP_FAIL, "ARKode",
                    "arkSetInterpolantType",
                    "Type cannot be specified after module initialization.");
    return(ARK_ILL_INPUT);
  }

  /* delete any existing interpolation module */
  if (ark_mem->interp != NULL) {
    arkInterpFree(ark_mem, ark_mem->interp);
    ark_mem->interp = NULL;
  }

  /* create requested interpolation module, initially specifying
     the maximum possible interpolant degree. */
  if (itype == ARK_INTERP_HERMITE) {
    ark_mem->interp = arkInterpCreate_Hermite(arkode_mem, ARK_INTERP_MAX_DEGREE);
  } else {
    ark_mem->interp = arkInterpCreate_Lagrange(arkode_mem, ARK_INTERP_MAX_DEGREE);
  }
  if (ark_mem->interp == NULL) {
    arkProcessError(ark_mem, ARK_MEM_FAIL, "ARKode", "arkSetInterpolantType",
                    "Unable to allocate interpolation structure");
    return(ARK_MEM_FAIL);
  }

  return(ARK_SUCCESS);
}